

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O0

void find_cnn_out_channels(CNN_LAYER_CONFIG *layer_config,int *channels_per_branch)

{
  int iVar1;
  int c_1;
  int c;
  int b;
  CNN_BRANCH_CONFIG *branch_config;
  int branch;
  int *channels_per_branch_local;
  CNN_LAYER_CONFIG *layer_config_local;
  
  iVar1 = layer_config->branch;
  for (b = 0; b < 4; b = b + 1) {
    if ((((layer_config->branch_config).input_to_branches & 1 << ((byte)b & 0x1f)) != 0) &&
       (b != iVar1)) {
      if (layer_config->branch_copy_type == '\x01') {
        channels_per_branch[b] = layer_config->in_channels;
      }
      else if (layer_config->branch_copy_type == '\x02') {
        channels_per_branch[b] = layer_config->out_channels;
      }
      else if (layer_config->branch_copy_type == '\x03') {
        channels_per_branch[b] = layer_config->out_channels;
        for (c = 0; c < 4; c = c + 1) {
          if ((((layer_config->branch_config).branches_to_combine & 1 << ((byte)c & 0x1f)) != 0) &&
             (c != iVar1)) {
            channels_per_branch[b] = channels_per_branch[c] + channels_per_branch[b];
          }
        }
      }
    }
  }
  channels_per_branch[iVar1] = layer_config->out_channels;
  for (c_1 = 0; c_1 < 4; c_1 = c_1 + 1) {
    if ((((layer_config->branch_config).branches_to_combine & 1 << ((byte)c_1 & 0x1f)) != 0) &&
       (c_1 != iVar1)) {
      channels_per_branch[iVar1] = channels_per_branch[c_1] + channels_per_branch[iVar1];
    }
  }
  return;
}

Assistant:

static void find_cnn_out_channels(const CNN_LAYER_CONFIG *layer_config,
                                  int channels_per_branch[]) {
  int branch = layer_config->branch;
  const CNN_BRANCH_CONFIG *branch_config = &layer_config->branch_config;
  for (int b = 0; b < CNN_MAX_BRANCHES; ++b) {
    if ((branch_config->input_to_branches & (1 << b)) && b != branch) {
      if (layer_config->branch_copy_type == BRANCH_INPUT) {
        channels_per_branch[b] = layer_config->in_channels;
      } else if (layer_config->branch_copy_type == BRANCH_OUTPUT) {
        channels_per_branch[b] = layer_config->out_channels;
      } else if (layer_config->branch_copy_type == BRANCH_COMBINED) {
        channels_per_branch[b] = layer_config->out_channels;
        for (int c = 0; c < CNN_MAX_BRANCHES; ++c) {
          if ((branch_config->branches_to_combine & (1 << c)) && c != branch) {
            assert(channels_per_branch[c] > 0);
            channels_per_branch[b] += channels_per_branch[c];
          }
        }
      }
    }
  }
  channels_per_branch[branch] = layer_config->out_channels;
  for (int c = 0; c < CNN_MAX_BRANCHES; ++c) {
    if ((branch_config->branches_to_combine & (1 << c)) && c != branch) {
      assert(channels_per_branch[c] > 0);
      channels_per_branch[branch] += channels_per_branch[c];
    }
  }
}